

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status parse_pchar(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  ulong uVar1;
  curi_status cVar2;
  uint uVar3;
  byte *pbVar4;
  
  uVar1 = *offset;
  pbVar4 = (byte *)"";
  if (uVar1 < len) {
    pbVar4 = (byte *)(uri + uVar1);
  }
  *offset = uVar1 + 1;
  uVar3 = *pbVar4 - 0x21;
  if (uVar3 < 0x5e) {
    switch((uint)*pbVar4) {
    default:
      return curi_status_success;
    case 0x22:
    case 0x23:
    case 0x2f:
    case 0x3c:
    case 0x3e:
    case 0x3f:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x60:
    case 0x7b:
    case 0x7c:
    case 0x7d:
      break;
    case 0x25:
      cVar2 = parse_h8(uri,len,offset,
                       (curi_settings *)
                       ((long)&switchD_0010296a::switchdataD_00103548 +
                       (long)(int)(&switchD_0010296a::switchdataD_00103548)[uVar3]),
                       &switchD_0010296a::switchdataD_00103548);
      return cVar2;
    }
  }
  return curi_status_error;
}

Assistant:

static curi_status parse_pchar(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // pchar = unreserved / "%" h8 / sub-delims / ":" / "@"
    switch (*read_char(uri,len,offset))
    {
        CASE_PCHAR_NO_PCT:
            return curi_status_success;
        case '%':
            return parse_h8(uri, len, offset, settings, userData);
        default:
            return curi_status_error;
    }
}